

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::Parser::Deserialize(Parser *this,Schema *schema)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  SymbolTable<flatbuffers::EnumDef> *pSVar3;
  StructDef *pSVar4;
  StructDef *pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  const_iterator cVar7;
  Namespace *pNVar8;
  const_iterator cVar9;
  ServiceDef *this_00;
  _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
  *this_01;
  unsigned_short vtsize;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  Schema *pSVar14;
  long lVar15;
  Schema *pSVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  EnumDef *this_02;
  uint8_t *offset_location_7;
  long lVar20;
  uint8_t *offset_location;
  long lVar21;
  bool bVar22;
  string qualified_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  namespaces_index;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  SymbolTable<flatbuffers::StructDef> *local_98;
  SymbolTable<flatbuffers::EnumDef> *local_90;
  key_type local_88;
  SymbolTable<flatbuffers::ServiceDef> *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  local_60;
  
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 9) ||
     (uVar18 = (ulong)*(ushort *)(schema + (8 - (long)*(int *)schema)), uVar18 == 0)) {
    pSVar14 = (Schema *)0x1b85d9;
    pSVar16 = (Schema *)0x1b85d9;
  }
  else {
    pSVar16 = schema + *(uint *)(schema + uVar18) + uVar18 + 4;
    pSVar14 = schema + (ulong)*(uint *)(schema + *(uint *)(schema + uVar18) + uVar18) +
                       *(uint *)(schema + uVar18) + uVar18 + 4;
  }
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,pSVar16,pSVar14);
  std::__cxx11::string::operator=((string *)&this->file_identifier_,(string *)local_d8);
  pSVar5 = (StructDef *)(local_d8 + 0x10);
  if ((StructDef *)local_d8._0_8_ != pSVar5) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
  }
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 0xb) ||
     (uVar18 = (ulong)*(ushort *)(schema + (10 - (long)*(int *)schema)), uVar18 == 0)) {
    pSVar14 = (Schema *)0x1b85d9;
    pSVar16 = (Schema *)0x1b85d9;
  }
  else {
    pSVar16 = schema + *(uint *)(schema + uVar18) + uVar18 + 4;
    pSVar14 = schema + (ulong)*(uint *)(schema + *(uint *)(schema + uVar18) + uVar18) +
                       *(uint *)(schema + uVar18) + uVar18 + 4;
  }
  local_d8._0_8_ = pSVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,pSVar16,pSVar14);
  std::__cxx11::string::operator=((string *)&this->file_extension_,(string *)local_d8);
  if ((StructDef *)local_d8._0_8_ != pSVar5) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_60._M_impl + 8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pSVar14 = (Schema *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (4 < *(ushort *)(schema + -(long)*(int *)schema)) {
    uVar18 = (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema));
    if (uVar18 == 0) {
      pSVar14 = (Schema *)0x0;
    }
    else {
      pSVar14 = schema + *(uint *)(schema + uVar18) + uVar18;
    }
  }
  local_98 = &this->structs_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar18 = (ulong)*(ushort *)(schema + -(long)*(int *)schema + 4);
    if (pSVar14 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar18) + uVar18) << 2) +
                 *(uint *)(schema + uVar18) + uVar18) {
      if ((*(ushort *)(schema + -(long)*(int *)schema) < 7) ||
         (uVar18 = (ulong)*(ushort *)(schema + (6 - (long)*(int *)schema)), uVar18 == 0)) {
        pSVar14 = (Schema *)0x0;
      }
      else {
        pSVar14 = schema + *(uint *)(schema + uVar18) + uVar18;
      }
      local_90 = &this->enums_;
      goto LAB_0012521a;
    }
    pSVar4 = (StructDef *)operator_new(0x148);
    StructDef::StructDef(pSVar4);
    uVar18 = (ulong)*(uint *)(pSVar14 + 4);
    lVar12 = uVar18 - (long)*(int *)(pSVar14 + uVar18 + 4);
    uVar10 = *(ushort *)(pSVar14 + lVar12 + 4);
    if (uVar10 < 0xd) {
      pSVar4->bytesize = 0;
      if (8 < uVar10) goto LAB_00125061;
      pSVar4->fixed = false;
LAB_0012509f:
      sVar17 = 0;
    }
    else {
      if ((ulong)*(ushort *)(pSVar14 + lVar12 + 0x10) == 0) {
        sVar17 = 0;
      }
      else {
        sVar17 = (size_t)*(int *)(pSVar14 + *(ushort *)(pSVar14 + lVar12 + 0x10) + uVar18 + 4);
      }
      pSVar4->bytesize = sVar17;
LAB_00125061:
      if ((ulong)*(ushort *)(pSVar14 + lVar12 + 0xc) == 0) {
        bVar22 = false;
      }
      else {
        bVar22 = pSVar14[*(ushort *)(pSVar14 + lVar12 + 0xc) + uVar18 + 4].super_Table != (Table)0x0
        ;
      }
      pSVar4->fixed = bVar22;
      if ((uVar10 < 0xb) || ((ulong)*(ushort *)(pSVar14 + lVar12 + 0xe) == 0)) goto LAB_0012509f;
      sVar17 = (size_t)*(int *)(pSVar14 + *(ushort *)(pSVar14 + lVar12 + 0xe) + uVar18 + 4);
    }
    pSVar4->minalign = sVar17;
    lVar12 = (ulong)*(uint *)(pSVar14 + uVar18 + *(ushort *)(pSVar14 + lVar12 + 8) + 4) +
             uVar18 + *(ushort *)(pSVar14 + lVar12 + 8);
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar14 + lVar12 + 8,
               pSVar14 + (ulong)*(uint *)(pSVar14 + lVar12 + 4) + lVar12 + 8);
    bVar22 = SymbolTable<flatbuffers::StructDef>::Add(local_98,(string *)local_d8,pSVar4);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    if (bVar22) {
      StructDef::~StructDef(pSVar4);
      uVar18 = 0x148;
      pSVar5 = pSVar4;
      goto LAB_00125405;
    }
    pSVar5 = (StructDef *)operator_new(0x20);
    (pSVar5->super_Definition).name._M_dataplus._M_p = (pointer)0xf;
    (pSVar5->super_Definition).name._M_string_length = (size_type)pSVar4;
    (pSVar5->super_Definition).name.field_2._M_allocated_capacity = 0;
    *(undefined2 *)((long)&(pSVar5->super_Definition).name.field_2 + 8) = 0;
    uVar18 = (ulong)*(uint *)(pSVar14 + 4);
    lVar12 = (ulong)*(uint *)(pSVar14 +
                             *(ushort *)
                              (pSVar14 + (uVar18 - (long)*(int *)(pSVar14 + uVar18 + 4)) + 8) +
                             uVar18 + 4) +
             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar14 + uVar18 + 4)) + 8) + uVar18;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar14 + lVar12 + 8,
               pSVar14 + (ulong)*(uint *)(pSVar14 + lVar12 + 4) + lVar12 + 8);
    bVar22 = SymbolTable<flatbuffers::Type>::Add(&this->types_,(string *)local_d8,(Type *)pSVar5);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar14 = pSVar14 + 4;
  } while (!bVar22);
  uVar18 = 0x20;
  goto LAB_00125405;
  while( true ) {
    pSVar4 = (StructDef *)operator_new(0x20);
    (pSVar4->super_Definition).name._M_dataplus._M_p = (pointer)0x10;
    (pSVar4->super_Definition).name._M_string_length = 0;
    *(StructDef **)&(pSVar4->super_Definition).name.field_2 = pSVar5;
    *(undefined2 *)((long)&(pSVar4->super_Definition).name.field_2 + 8) = 0;
    uVar18 = (ulong)*(uint *)pSVar16;
    lVar12 = (ulong)*(uint *)(pSVar16 +
                             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8)
                             + uVar18) +
             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8) + uVar18;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar16 + lVar12 + 4,
               pSVar16 + (ulong)*(uint *)(pSVar16 + lVar12) + lVar12 + 4);
    bVar22 = SymbolTable<flatbuffers::Type>::Add(&this->types_,(string *)local_d8,(Type *)pSVar4);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar14 = pSVar16;
    if (bVar22) break;
LAB_0012521a:
    pSVar16 = pSVar14 + 4;
    uVar11 = *(uint *)schema;
    uVar18 = (ulong)*(ushort *)(schema + (6 - (long)(int)uVar11));
    if (pSVar16 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar18) + uVar18) << 2) +
                 *(uint *)(schema + uVar18) + uVar18 + 4) {
      lVar12 = -(long)(int)uVar11;
      uVar18 = (ulong)*(ushort *)(schema + lVar12 + 4);
      if (uVar18 == 0) {
        pSVar14 = (Schema *)0x0;
      }
      else {
        uVar11 = *(uint *)(schema + uVar18);
        pSVar14 = schema + uVar11 + uVar18;
      }
      if (pSVar14 ==
          schema + (ulong)(uint)(*(int *)(schema + uVar11 + uVar18) << 2) + uVar11 + uVar18)
      goto LAB_0012558f;
      goto LAB_00125467;
    }
    pSVar5 = (StructDef *)operator_new(0x138);
    EnumDef::EnumDef((EnumDef *)pSVar5);
    uVar18 = (ulong)*(uint *)pSVar16;
    lVar12 = (ulong)*(uint *)(pSVar16 +
                             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8)
                             + uVar18) +
             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8) + uVar18;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar16 + lVar12 + 4,
               pSVar16 + (ulong)*(uint *)(pSVar16 + lVar12) + lVar12 + 4);
    bVar22 = SymbolTable<flatbuffers::EnumDef>::Add(local_90,(string *)local_d8,(EnumDef *)pSVar5);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    if (bVar22) {
      SymbolTable<flatbuffers::EnumVal>::~SymbolTable
                ((SymbolTable<flatbuffers::EnumVal> *)
                 &(pSVar5->fields).dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
      SymbolTable<flatbuffers::Value>::~SymbolTable(&(pSVar5->super_Definition).attributes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&(pSVar5->super_Definition).doc_comment);
      pcVar2 = (pSVar5->super_Definition).file._M_dataplus._M_p;
      paVar6 = &(pSVar5->super_Definition).file.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar6) {
        operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
      }
      pcVar2 = (pSVar5->super_Definition).name._M_dataplus._M_p;
      paVar6 = &(pSVar5->super_Definition).name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar6) {
        operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
      }
      uVar18 = 0x138;
      goto LAB_00125405;
    }
  }
  uVar18 = 0x20;
  pSVar5 = pSVar4;
  goto LAB_00125405;
  while( true ) {
    lVar12 = -(long)*(int *)schema;
    if (((0xc < *(ushort *)(schema + -(long)*(int *)schema)) &&
        (uVar18 = (ulong)*(ushort *)(schema + lVar12 + 0xc), uVar18 != 0)) &&
       (pSVar16 + *(uint *)pSVar16 == schema + *(uint *)(schema + uVar18) + uVar18)) {
      this->root_struct_def_ = pSVar5;
    }
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      lVar12 = -(long)*(int *)schema;
    }
    uVar18 = (ulong)*(ushort *)(schema + lVar12 + 4);
    pSVar14 = pSVar16;
    if (pSVar16 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar18) + uVar18) << 2) +
                 *(uint *)(schema + uVar18) + uVar18) break;
LAB_00125467:
    pSVar16 = pSVar14 + 4;
    uVar18 = (ulong)*(uint *)pSVar16;
    lVar12 = (ulong)*(uint *)(pSVar16 +
                             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8)
                             + uVar18) +
             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8) + uVar18;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar16 + lVar12 + 4,
               pSVar16 + (ulong)*(uint *)(pSVar16 + lVar12) + lVar12 + 4);
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)local_98,(string *)local_d8);
    if ((_Rb_tree_header *)cVar7._M_node ==
        &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header) {
      pSVar5 = (StructDef *)0x0;
    }
    else {
      pSVar5 = *(StructDef **)(cVar7._M_node + 2);
    }
    pNVar8 = anon_unknown_0::GetNamespace
                       ((string *)local_d8,&this->namespaces_,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                         *)&local_60);
    (pSVar5->super_Definition).defined_namespace = pNVar8;
    bVar22 = StructDef::Deserialize(pSVar5,this,(Object *)(pSVar16 + *(uint *)pSVar16));
    if (!bVar22) {
      if ((StructDef *)local_d8._0_8_ == (StructDef *)(local_d8 + 0x10)) goto LAB_0012540a;
      goto LAB_001258f5;
    }
  }
  if (*(ushort *)(schema + lVar12) < 7) {
LAB_001255a7:
    pSVar14 = (Schema *)0x0;
  }
  else {
LAB_0012558f:
    uVar18 = (ulong)*(ushort *)(schema + lVar12 + 6);
    if (uVar18 == 0) goto LAB_001255a7;
    pSVar14 = schema + *(uint *)(schema + uVar18) + uVar18;
  }
  local_98 = (SymbolTable<flatbuffers::StructDef> *)&this->namespaces_;
  do {
    pSVar16 = pSVar14 + 4;
    uVar18 = (ulong)*(int *)schema;
    uVar13 = (ulong)*(ushort *)(schema + -uVar18 + 6);
    if (pSVar16 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar13) + uVar13) << 2) +
                 *(uint *)(schema + uVar13) + uVar13 + 4) {
      uVar10 = *(ushort *)(schema + -uVar18);
      if (uVar10 < 0xf) goto LAB_00125902;
      lVar12 = -uVar18;
      uVar13 = (ulong)*(ushort *)(schema + lVar12 + 0xe);
      if ((uVar13 == 0) ||
         (uVar19 = (ulong)*(uint *)(schema + uVar13),
         (*(uint *)(schema + uVar19 + uVar13) & 0x3fffffff) == 0)) goto LAB_001258c4;
      local_68 = &this->services_;
      lVar20 = uVar13 + uVar19 + 8;
      lVar12 = uVar13 + uVar19;
      goto LAB_00125714;
    }
    uVar18 = (ulong)*(uint *)pSVar16;
    lVar12 = (ulong)*(uint *)(pSVar16 +
                             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8)
                             + uVar18) +
             *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar16 + uVar18)) + 8) + uVar18;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar16 + lVar12 + 4,
               pSVar16 + (ulong)*(uint *)(pSVar16 + lVar12) + lVar12 + 4);
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                    *)local_90,(string *)local_d8);
    if ((_Rb_tree_header *)cVar9._M_node == &(this->enums_).dict._M_t._M_impl.super__Rb_tree_header)
    {
      this_02 = (EnumDef *)0x0;
    }
    else {
      this_02 = *(EnumDef **)(cVar9._M_node + 2);
    }
    pNVar8 = anon_unknown_0::GetNamespace
                       ((string *)local_d8,
                        (vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                         *)local_98,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                         *)&local_60);
    (this_02->super_Definition).defined_namespace = pNVar8;
    bVar22 = EnumDef::Deserialize(this_02,this,(Enum *)(pSVar16 + *(uint *)pSVar16));
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar14 = pSVar16;
  } while (bVar22);
  goto LAB_0012540a;
code_r0x001258bb:
  lVar12 = -uVar18;
  uVar10 = *(ushort *)(schema + -uVar18);
LAB_001258c4:
  if (uVar10 < 0x11) {
LAB_00125902:
    this->advanced_features_ = 0;
  }
  else {
    if ((ulong)*(ushort *)(schema + lVar12 + 0x10) == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)*(uint *)(schema + *(ushort *)(schema + lVar12 + 0x10));
    }
    this->advanced_features_ = uVar13;
    bVar22 = true;
    if ((uVar10 < 0x13) || (uVar13 = (ulong)*(ushort *)(schema + lVar12 + 0x12), uVar13 == 0))
    goto LAB_0012540c;
    if ((*(uint *)(schema + *(uint *)(schema + uVar13) + uVar13) & 0x3fffffff) == 0)
    goto LAB_0012540c;
    pSVar14 = schema + *(uint *)(schema + uVar13) + uVar13;
    paVar6 = &local_88.field_2;
    do {
      pSVar14 = pSVar14 + 4;
      uVar13 = (ulong)*(uint *)pSVar14;
      uVar11 = *(uint *)(pSVar14 + uVar13);
      uVar10 = *(ushort *)(pSVar14 + (uVar13 - (long)(int)uVar11) + 6);
      uVar19 = (ulong)uVar10;
      if (*(ushort *)(pSVar14 + (uVar13 - (long)(int)uVar11)) < 7) {
        uVar11 = *(uint *)(pSVar14 + uVar19 + uVar13);
LAB_00125a24:
        pSVar16 = (Schema *)0x0;
      }
      else {
        if (uVar10 == 0) {
          uVar10 = 0;
          goto LAB_00125a24;
        }
        uVar11 = *(uint *)(pSVar14 + uVar19 + uVar13);
        pSVar16 = pSVar14 + (ulong)uVar11 + uVar19 + uVar13;
      }
      if (pSVar16 !=
          pSVar14 + (ulong)(uint)(*(int *)(pSVar14 + (ulong)uVar11 + uVar10 + uVar13) << 2) +
                    (ulong)uVar11 + uVar10 + uVar13) {
        pSVar16 = pSVar16 + 8;
        do {
          local_d8._0_8_ = local_d8 + 0x10;
          local_d8._8_8_ = 0;
          local_d8[0x10] = '\0';
          local_b8._M_allocated_capacity = (size_type)&local_a8;
          local_b8._8_8_ = 0;
          local_a8._M_local_buf[0] = '\0';
          local_88._M_dataplus._M_p = (pointer)paVar6;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pSVar16 + *(uint *)(pSVar16 + -4),
                     pSVar16 + *(uint *)(pSVar16 + -4) +
                     *(uint *)(pSVar16 + ((ulong)*(uint *)(pSVar16 + -4) - 4)));
          std::__cxx11::string::operator=((string *)local_b8._M_local_buf,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar6) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          uVar18 = (ulong)*(uint *)pSVar14;
          lVar12 = *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar14 + uVar18)) + 4) + uVar18;
          local_88._M_dataplus._M_p = (pointer)paVar6;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,
                     pSVar14 + (ulong)*(uint *)(pSVar14 +
                                               *(ushort *)
                                                (pSVar14 +
                                                (uVar18 - (long)*(int *)(pSVar14 + uVar18)) + 4) +
                                               uVar18) + 4 + lVar12,
                     pSVar14 + (ulong)*(uint *)(pSVar14 + (ulong)*(uint *)(pSVar14 +
                                                                          *(ushort *)
                                                                           (pSVar14 +
                                                                           (uVar18 - (long)*(int *)(
                                                  pSVar14 + uVar18)) + 4) + uVar18) + 4 + lVar12 +
                                               -4) +
                               (ulong)*(uint *)(pSVar14 +
                                               *(ushort *)
                                                (pSVar14 +
                                                (uVar18 - (long)*(int *)(pSVar14 + uVar18)) + 4) +
                                               uVar18) + lVar12 + 4);
          this_01 = (_Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                       ::operator[](&this->files_included_per_file_,&local_88);
          std::
          _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
          ::_M_insert_unique<flatbuffers::IncludedFile_const&>(this_01,(IncludedFile *)local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar6) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_allocated_capacity != &local_a8) {
            operator_delete((void *)local_b8._M_allocated_capacity,
                            CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                            + 1);
          }
          if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
          }
          uVar18 = (ulong)*(uint *)pSVar14;
          lVar12 = *(ushort *)(pSVar14 + (uVar18 - (long)*(int *)(pSVar14 + uVar18)) + 6) + uVar18;
          bVar22 = pSVar16 !=
                   pSVar14 + (ulong)(uint)(*(int *)(pSVar14 +
                                                   (ulong)*(uint *)(pSVar14 +
                                                                   *(ushort *)
                                                                    (pSVar14 +
                                                                    (uVar18 - (long)*(int *)(pSVar14
                                                                                            + uVar18
                                                  )) + 6) + uVar18) + lVar12) << 2) +
                             (ulong)*(uint *)(pSVar14 +
                                             *(ushort *)
                                              (pSVar14 +
                                              (uVar18 - (long)*(int *)(pSVar14 + uVar18)) + 6) +
                                             uVar18) + lVar12 + 4;
          pSVar16 = pSVar16 + 4;
        } while (bVar22);
        uVar18 = (ulong)*(uint *)schema;
      }
      uVar13 = (ulong)*(ushort *)(schema + (0x12 - (long)(int)uVar18));
    } while (pSVar14 !=
             schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar13) + uVar13) << 2) +
                      *(uint *)(schema + uVar13) + uVar13);
  }
  bVar22 = true;
  goto LAB_0012540c;
LAB_00125714:
  lVar21 = lVar12 + 4;
  uVar18 = (ulong)*(uint *)(schema + lVar21);
  lVar15 = (ulong)*(uint *)(schema + *(ushort *)
                                      (schema + (uVar18 - (long)*(int *)(schema + uVar18 + lVar21))
                                                + 4 + lVar21) + uVar18 + lVar21) +
           *(ushort *)(schema + (uVar18 - (long)*(int *)(schema + uVar18 + lVar21)) + 4 + lVar21) +
           uVar18;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,schema + lVar15 + lVar20,
             schema + (ulong)*(uint *)(schema + lVar15 + lVar21) + lVar15 + lVar20);
  this_00 = (ServiceDef *)operator_new(0x110);
  paVar6 = &(this_00->super_Definition).name.field_2;
  memset(paVar6,0,0xd0);
  (this_00->super_Definition).name._M_dataplus._M_p = (pointer)paVar6;
  (this_00->super_Definition).name._M_string_length = 0;
  local_90 = (SymbolTable<flatbuffers::EnumDef> *)&(this_00->super_Definition).file.field_2;
  (this_00->super_Definition).file._M_dataplus._M_p = (pointer)local_90;
  (this_00->super_Definition).file.field_2._M_local_buf[0] = '\0';
  (this_00->super_Definition).doc_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_Definition).doc_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_Definition).doc_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
  *(_Base_ptr *)
   ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header
   + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x18) = p_Var1;
  (this_00->super_Definition).serialized_location = 0;
  (this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_Definition).generated = false;
  (this_00->super_Definition).index = -1;
  (this_00->super_Definition).refcount = 1;
  p_Var1 = &(this_00->calls).dict._M_t._M_impl.super__Rb_tree_header;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->calls).vec.
  super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->calls).vec.
  super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->calls).vec.
  super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar8 = anon_unknown_0::GetNamespace
                     ((string *)local_d8,
                      (vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_> *
                      )local_98,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                       *)&local_60);
  (this_00->super_Definition).defined_namespace = pNVar8;
  bVar22 = ServiceDef::Deserialize
                     (this_00,this,(Service *)(schema + (ulong)*(uint *)(schema + lVar21) + lVar21))
  ;
  if ((bVar22) &&
     (bVar22 = SymbolTable<flatbuffers::ServiceDef>::Add(local_68,(string *)local_d8,this_00),
     !bVar22)) {
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    uVar18 = (ulong)*(int *)schema;
    uVar13 = (ulong)*(ushort *)(schema + -uVar18 + 0xe);
    lVar15 = lVar12 + 8;
    lVar20 = lVar20 + 4;
    lVar12 = lVar21;
    if (schema + lVar15 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar13) + uVar13) << 2) +
                 *(uint *)(schema + uVar13) + uVar13 + 4) goto code_r0x001258bb;
    goto LAB_00125714;
  }
  SymbolTable<flatbuffers::RPCCall>::~SymbolTable(&this_00->calls);
  SymbolTable<flatbuffers::Value>::~SymbolTable(&(this_00->super_Definition).attributes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this_00->super_Definition).doc_comment);
  pSVar3 = (SymbolTable<flatbuffers::EnumDef> *)(this_00->super_Definition).file._M_dataplus._M_p;
  if (pSVar3 != local_90) {
    operator_delete(pSVar3,((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_90->dict)->_M_allocated_capacity + 1);
  }
  pcVar2 = (this_00->super_Definition).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  operator_delete(this_00,0x110);
  if ((StructDef *)local_d8._0_8_ == (StructDef *)(local_d8 + 0x10)) goto LAB_0012540a;
LAB_001258f5:
  uVar18 = CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1;
  pSVar5 = (StructDef *)local_d8._0_8_;
LAB_00125405:
  operator_delete(pSVar5,uVar18);
LAB_0012540a:
  bVar22 = false;
LAB_0012540c:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  ::~_Rb_tree(&local_60);
  return bVar22;
}

Assistant:

bool Parser::Deserialize(const reflection::Schema *schema) {
  file_identifier_ = schema->file_ident() ? schema->file_ident()->str() : "";
  file_extension_ = schema->file_ext() ? schema->file_ext()->str() : "";
  std::map<std::string, Namespace *> namespaces_index;

  // Create defs without deserializing so references from fields to structs and
  // enums can be resolved.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    auto struct_def = new StructDef();
    struct_def->bytesize = it->bytesize();
    struct_def->fixed = it->is_struct();
    struct_def->minalign = it->minalign();
    if (structs_.Add(it->name()->str(), struct_def)) {
      delete struct_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_STRUCT, struct_def, nullptr);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    auto enum_def = new EnumDef();
    if (enums_.Add(it->name()->str(), enum_def)) {
      delete enum_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_UNION, nullptr, enum_def);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }

  // Now fields can refer to structs and enums by index.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    std::string qualified_name = it->name()->str();
    auto struct_def = structs_.Lookup(qualified_name);
    struct_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!struct_def->Deserialize(*this, *it)) { return false; }
    if (schema->root_table() == *it) { root_struct_def_ = struct_def; }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    std::string qualified_name = it->name()->str();
    auto enum_def = enums_.Lookup(qualified_name);
    enum_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!enum_def->Deserialize(*this, *it)) { return false; }
  }

  if (schema->services()) {
    for (auto it = schema->services()->begin(); it != schema->services()->end();
         ++it) {
      std::string qualified_name = it->name()->str();
      auto service_def = new ServiceDef();
      service_def->defined_namespace =
          GetNamespace(qualified_name, namespaces_, namespaces_index);
      if (!service_def->Deserialize(*this, *it) ||
          services_.Add(qualified_name, service_def)) {
        delete service_def;
        return false;
      }
    }
  }
  advanced_features_ = schema->advanced_features();

  if (schema->fbs_files())
    for (auto s = schema->fbs_files()->begin(); s != schema->fbs_files()->end();
         ++s) {
      for (auto f = s->included_filenames()->begin();
           f != s->included_filenames()->end(); ++f) {
        IncludedFile included_file;
        included_file.filename = f->str();
        files_included_per_file_[s->filename()->str()].insert(included_file);
      }
    }

  return true;
}